

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addGlobal
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,undefined8 param_3_00,
          size_t param_4,ImportNames *param_2,undefined8 param_3)

{
  Expression *pEVar1;
  bool bVar2;
  Expression **ppEVar3;
  reference this_00;
  pointer pGVar4;
  Ok local_41;
  undefined8 local_40;
  ImportNames *param_3_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2_local;
  ParseDefsCtx *this_local;
  undefined8 local_20;
  Name param_1_local;
  
  local_40 = param_3;
  param_3_local = param_2;
  param_2_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  local_20 = param_3_00;
  param_1_local.super_IString.str._M_len = param_4;
  param_1_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&stack0x00000008);
  if (bVar2) {
    ppEVar3 = std::optional<wasm::Expression_*>::operator*
                        ((optional<wasm::Expression_*> *)&stack0x00000008);
    pEVar1 = *ppEVar3;
    this_00 = std::
              vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ::operator[](&this->wasm->globals,(ulong)this->index);
    pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_00);
    pGVar4->init = pEVar1;
  }
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_41);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addGlobal(Name,
                                 const std::vector<Name>&,
                                 ImportNames*,
                                 GlobalTypeT,
                                 std::optional<ExprT> exp,
                                 Index) {
  if (exp) {
    wasm.globals[index]->init = *exp;
  }
  return Ok{};
}